

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::writeLPF
          (SPxLPBase<double> *this,ostream *p_output,NameSet *p_rnames,NameSet *p_cnames,
          DIdxSet *p_intvars,bool writeZeroObjective)

{
  double dVar1;
  pointer pdVar2;
  bool bVar3;
  IdxSet *this_00;
  uint uVar4;
  int iVar5;
  Nonzero<double> *pNVar6;
  size_t sVar7;
  ostream *poVar8;
  Item *pIVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  double *p_lhs;
  undefined7 in_register_00000089;
  int iVar15;
  long lVar16;
  int iVar17;
  long in_FS_OFFSET;
  double lhs;
  char name [16];
  double rhs;
  double local_b8;
  double local_b0;
  NameSet *local_a8;
  double local_a0;
  undefined **local_98;
  SVectorBase<double> local_90;
  Nonzero<double> *local_80 [2];
  double local_70;
  double local_68;
  undefined8 uStack_60;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  IdxSet *local_38;
  
  local_b0 = (double)CONCAT44(local_b0._4_4_,(int)CONCAT71(in_register_00000089,writeZeroObjective))
  ;
  lVar16 = *(long *)p_output;
  *(undefined8 *)(p_output + *(long *)(lVar16 + -0x18) + 8) = 0x10;
  lVar16 = *(long *)(lVar16 + -0x18);
  *(uint *)(p_output + lVar16 + 0x18) = *(uint *)(p_output + lVar16 + 0x18) & 0xfffffefb | 0x100;
  local_a0 = (double)CONCAT44(local_a0._4_4_,this->thesense);
  pcVar14 = "Maximize\n";
  if (this->thesense == MINIMIZE) {
    pcVar14 = "Minimize\n";
  }
  local_a8 = p_cnames;
  local_38 = &p_intvars->super_IdxSet;
  std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,9);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"  obj: ",7);
  local_90.m_elem = (Nonzero<double> *)0x0;
  local_90.memsize = 0;
  local_90.memused = 0;
  local_98 = &PTR__DSVectorBase_006aae80;
  local_80[0] = (Nonzero<double> *)0x0;
  uVar4 = (uint)((ulong)((long)(this->super_LPColSetBase<double>).object.val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->super_LPColSetBase<double>).object.val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  uVar10 = 2;
  if (0 < (int)uVar4) {
    uVar10 = uVar4;
  }
  spx_alloc<soplex::Nonzero<double>*>(local_80,uVar10);
  local_90.m_elem = local_80[0];
  iVar17 = 0;
  local_90.memused = 0;
  local_90.memsize = uVar10;
  iVar15 = (int)((ulong)((long)(this->super_LPColSetBase<double>).object.val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->super_LPColSetBase<double>).object.val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  if (iVar15 < 1) {
    iVar15 = 0;
  }
  spx_realloc<soplex::Nonzero<double>*>(local_80,iVar15);
  local_90.m_elem = local_80[0];
  pdVar2 = (this->super_LPColSetBase<double>).object.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar10 = (uint)((ulong)((long)(this->super_LPColSetBase<double>).object.val.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
  if (0 < (int)uVar10) {
    iVar17 = 0;
    pNVar6 = local_80[0];
    uVar12 = (ulong)(uVar10 & 0x7fffffff);
    do {
      uVar11 = uVar12 - 1;
      dVar1 = pdVar2[uVar11];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        pNVar6->idx = (int)uVar11;
        pNVar6->val = dVar1;
        pNVar6 = pNVar6 + 1;
        iVar17 = iVar17 + 1;
      }
      bVar3 = 1 < (long)uVar12;
      uVar12 = uVar11;
    } while (bVar3);
  }
  local_90.memused = iVar17;
  local_90.memsize = iVar15;
  if (iVar17 != 0) {
    pNVar6 = local_80[0];
    do {
      pNVar6->val = pNVar6->val * (double)local_a0._0_4_;
      pNVar6 = pNVar6 + 1;
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
  }
  LPFwriteSVector<double>(this,p_output,local_a8,&local_90,local_b0._0_1_);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n",1);
  local_98 = &PTR__DSVectorBase_006aae80;
  if (local_80[0] != (Nonzero<double> *)0x0) {
    free(local_80[0]);
    local_80[0] = (Nonzero<double> *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"Subject To\n",0xb);
  iVar15 = (int)p_output;
  if (0 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
    local_48 = *(double *)(in_FS_OFFSET + -8);
    uStack_40 = 0;
    local_68 = -local_48;
    uStack_60 = 0x8000000000000000;
    lVar16 = 0;
    do {
      local_b8 = (this->super_LPRowSetBase<double>).left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar16];
      local_a0 = (this->super_LPRowSetBase<double>).right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar16];
      local_b0 = local_b8;
      local_50 = local_a0;
      ::soplex::infinity::__tls_init();
      iVar17 = (int)lVar16;
      if ((local_b0 <= local_68) || (::soplex::infinity::__tls_init(), local_48 <= local_a0)) {
LAB_001b08bd:
        std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
        pcVar14 = LPFgetRowName<double>(this,iVar17,p_rnames,(char *)&local_98,iVar17);
        if (pcVar14 == (char *)0x0) {
          std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar7 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(p_output," : ",3);
        pIVar9 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                 (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar16].idx;
        p_lhs = &local_b8;
      }
      else {
        if ((local_b0 == local_a0) && (!NAN(local_b0) && !NAN(local_a0))) goto LAB_001b08bd;
        std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
        pcVar14 = LPFgetRowName<double>(this,iVar17,p_rnames,(char *)&local_98,iVar17);
        if (pcVar14 == (char *)0x0) {
          std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar7 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"_1 : ",5);
        iVar5 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar16].idx;
        pIVar9 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
        ::soplex::infinity::__tls_init();
        local_70 = local_48;
        LPFwriteRow<double>(this,p_output,local_a8,(SVectorBase<double> *)(pIVar9 + iVar5),&local_b8
                            ,&local_70);
        std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
        pcVar14 = LPFgetRowName<double>(this,iVar17,p_rnames,(char *)&local_98,iVar17);
        if (pcVar14 == (char *)0x0) {
          std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar7 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"_2 : ",5);
        pIVar9 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                 (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar16].idx;
        ::soplex::infinity::__tls_init();
        local_70 = local_68;
        p_lhs = &local_70;
      }
      LPFwriteRow<double>(this,p_output,local_a8,(SVectorBase<double> *)pIVar9,p_lhs,&local_50);
      lVar16 = lVar16 + 1;
    } while (lVar16 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"Bounds\n",7);
  this_00 = local_38;
  if (0 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
    local_68 = *(double *)(in_FS_OFFSET + -8);
    uStack_60 = 0;
    local_48 = -local_68;
    uStack_40 = 0x8000000000000000;
    lVar16 = 0;
    do {
      dVar1 = (this->super_LPColSetBase<double>).low.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar16];
      local_b0 = (this->super_LPColSetBase<double>).up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar16];
      iVar17 = (int)lVar16;
      if ((dVar1 != local_b0) || (NAN(dVar1) || NAN(local_b0))) {
        local_a0 = dVar1;
        ::soplex::infinity::__tls_init();
        if (local_a0 <= local_48) {
          ::soplex::infinity::__tls_init();
          if (local_68 <= local_b0) {
            std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
            pcVar14 = getColName<double>(this,iVar17,local_a8,(char *)&local_98);
            if (pcVar14 == (char *)0x0) {
              std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
            }
            else {
              sVar7 = strlen(pcVar14);
              std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,sVar7);
            }
            lVar13 = 6;
            pcVar14 = " free\n";
            poVar8 = p_output;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(p_output,"   -Inf <= ",0xb);
            pcVar14 = getColName<double>(this,iVar17,local_a8,(char *)&local_98);
            if (pcVar14 == (char *)0x0) {
              std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
            }
            else {
              sVar7 = strlen(pcVar14);
              std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>(p_output," <= ",4);
LAB_001b0e91:
            poVar8 = std::ostream::_M_insert<double>(local_b0);
LAB_001b0ed0:
            local_b8 = (double)CONCAT71(local_b8._1_7_,10);
            lVar13 = 1;
            pcVar14 = (char *)&local_b8;
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar14,lVar13);
        }
        else {
          ::soplex::infinity::__tls_init();
          if (local_b0 < local_68) {
            std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
            if ((local_a0 != 0.0) || (NAN(local_a0))) {
              poVar8 = std::ostream::_M_insert<double>(local_a0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," <= ",4);
              pcVar14 = getColName<double>(this,iVar17,local_a8,(char *)&local_98);
              if (pcVar14 == (char *)0x0) {
                std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
              }
              else {
                sVar7 = strlen(pcVar14);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar14,sVar7);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," <= ",4);
              goto LAB_001b0e91;
            }
            pcVar14 = getColName<double>(this,iVar17,local_a8,(char *)&local_98);
            if (pcVar14 == (char *)0x0) {
              std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
            }
            else {
              sVar7 = strlen(pcVar14);
              std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,sVar7);
            }
            lVar13 = 4;
            pcVar14 = " <= ";
            goto LAB_001b0c62;
          }
          if ((local_a0 != 0.0) || (NAN(local_a0))) {
            std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
            poVar8 = std::ostream::_M_insert<double>(local_a0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," <= ",4);
            pcVar14 = getColName<double>(this,iVar17,local_a8,(char *)&local_98);
            if (pcVar14 == (char *)0x0) {
              std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
            }
            else {
              sVar7 = strlen(pcVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar14,sVar7);
            }
            goto LAB_001b0ed0;
          }
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
        pcVar14 = getColName<double>(this,iVar17,local_a8,(char *)&local_98);
        if (pcVar14 == (char *)0x0) {
          std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar7 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,sVar7);
        }
        lVar13 = 3;
        pcVar14 = " = ";
LAB_001b0c62:
        std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,lVar13);
        poVar8 = std::ostream::_M_insert<double>(local_b0);
        local_b8 = (double)CONCAT71(local_b8._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_b8,1);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  if (((this_00 != (IdxSet *)0x0) && (0 < this_00->num)) &&
     (std::__ostream_insert<char,std::char_traits<char>>(p_output,"Generals\n",9),
     0 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum)) {
    iVar17 = 0;
    do {
      iVar5 = IdxSet::pos(this_00,iVar17);
      if (-1 < iVar5) {
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
        pcVar14 = getColName<double>(this,iVar17,local_a8,(char *)&local_98);
        if (pcVar14 == (char *)0x0) {
          std::ios::clear(iVar15 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar7 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar14,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n",1);
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"End",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + (char)p_output);
  std::ostream::put((char)p_output);
  std::ostream::flush();
  return;
}

Assistant:

inline
void SPxLPBase<R>::writeLPF(
   std::ostream&  p_output,          ///< output stream
   const NameSet* p_rnames,          ///< row names
   const NameSet* p_cnames,          ///< column names
   const DIdxSet* p_intvars,         ///< integer variables
   const bool     writeZeroObjective ///< write zero objective coefficients
) const
{
   SPxOut::setScientific(p_output, 16);

   LPFwriteObjective(*this, p_output, p_cnames, writeZeroObjective);
   LPFwriteRows(*this, p_output, p_rnames, p_cnames);
   LPFwriteBounds(*this, p_output, p_cnames);
   LPFwriteGenerals(*this, p_output, p_cnames, p_intvars);

   p_output << "End" << std::endl;
}